

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          StructSchema *params)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  ulong uVar7;
  uint hash;
  Entry *pEVar8;
  uint64_t *in_R8;
  HandlerBase *pHVar9;
  Maybe<unsigned_long> MVar10;
  Type local_40;
  
  pEVar8 = table.ptr;
  lVar1._0_2_ = pEVar8[1].key.baseType;
  lVar1._2_1_ = pEVar8[1].key.listDepth;
  lVar1._3_1_ = pEVar8[1].key.isImplicitParam;
  lVar1._4_2_ = pEVar8[1].key.field_3;
  lVar1._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
  aVar6.value = table.size_;
  if (lVar1 != 0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar4 = kj::_::chooseBucket(hash,(uint)lVar1);
    uVar7 = (ulong)uVar4;
    iVar5 = *(int *)((long)&pEVar8->value[uVar7]._vptr_HandlerBase + 4);
    aVar6 = extraout_RDX;
    if (iVar5 != 0) {
      pHVar9 = pEVar8->value + uVar7;
      do {
        if ((iVar5 != 1) && (*(uint *)&pHVar9->_vptr_HandlerBase == hash)) {
          local_40.field_4.scopeId = *in_R8;
          local_40.baseType = STRUCT;
          local_40.listDepth = '\0';
          bVar3 = capnp::Type::operator==
                            ((Type *)(table.size_ + (ulong)(iVar5 - 2) * 0x18),&local_40);
          aVar6 = extraout_RDX_00;
          if (bVar3) {
            iVar5 = *(int *)((long)&pHVar9->_vptr_HandlerBase + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)
                    0x1;
            *(ulong *)(this + 8) = (ulong)(iVar5 - 2);
            goto LAB_001f542e;
          }
        }
        uVar2._0_2_ = pEVar8[1].key.baseType;
        uVar2._2_1_ = pEVar8[1].key.listDepth;
        uVar2._3_1_ = pEVar8[1].key.isImplicitParam;
        uVar2._4_2_ = pEVar8[1].key.field_3;
        uVar2._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
        if (uVar7 + 1 == uVar2) {
          uVar7 = 0;
        }
        else {
          uVar7 = uVar7 + 1 & 0xffffffff;
        }
        pHVar9 = pEVar8->value + uVar7;
        iVar5 = *(int *)((long)&pHVar9->_vptr_HandlerBase + 4);
      } while (iVar5 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
LAB_001f542e:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }